

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

char * __thiscall spirv_cross::CompilerGLSL::index_to_swizzle(CompilerGLSL *this,uint32_t index)

{
  if (index - 1 < 3) {
    return *(char **)(&DAT_0039ef88 + (ulong)(index - 1) * 8);
  }
  return "x";
}

Assistant:

const char *CompilerGLSL::index_to_swizzle(uint32_t index)
{
	switch (index)
	{
	case 0:
		return "x";
	case 1:
		return "y";
	case 2:
		return "z";
	case 3:
		return "w";
	default:
		return "x";		// Don't crash, but engage the "undefined behavior" described for out-of-bounds logical addressing in spec.
	}
}